

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint __thiscall llvm::dwarf::getLanguage(dwarf *this,StringRef LanguageString)

{
  StringRef S;
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringRef local_2c0;
  StringRef local_2b0;
  StringRef local_2a0;
  StringRef local_290;
  StringRef local_280;
  StringRef local_270;
  StringRef local_260;
  StringRef local_250;
  StringRef local_240;
  StringRef local_230;
  StringRef local_220;
  StringRef local_210;
  StringRef local_200;
  StringRef local_1f0;
  StringRef local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  StringRef local_1b0;
  StringRef local_1a0;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  dwarf *local_40;
  char *local_38;
  StringSwitch<unsigned_int,_unsigned_int> local_30;
  dwarf *local_18;
  StringRef LanguageString_local;
  
  local_38 = LanguageString.Data;
  S.Length = (size_t)local_38;
  S.Data = (char *)this;
  local_40 = this;
  local_18 = this;
  LanguageString_local.Data = local_38;
  StringSwitch<unsigned_int,_unsigned_int>::StringSwitch(&local_30,S);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_50,(char (*) [12])"DW_LANG_C89");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_30,(StringLiteral)local_50,1);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_60,(char (*) [10])"DW_LANG_C");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_60,2);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_70,(char (*) [14])"DW_LANG_Ada83");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_70,3);
  StringLiteral::StringLiteral<20UL>
            ((StringLiteral *)&local_80,(char (*) [20])"DW_LANG_C_plus_plus");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_80,4);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_90,(char (*) [16])"DW_LANG_Cobol74");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_90,5);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_a0,(char (*) [16])"DW_LANG_Cobol85");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a0,6);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_b0,(char (*) [18])"DW_LANG_Fortran77");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_b0,7);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_c0,(char (*) [18])"DW_LANG_Fortran90");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_c0,8);
  StringLiteral::StringLiteral<17UL>((StringLiteral *)&local_d0,(char (*) [17])"DW_LANG_Pascal83");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_d0,9);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_e0,(char (*) [16])"DW_LANG_Modula2");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_e0,10);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_f0,(char (*) [13])"DW_LANG_Java");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_f0,0xb);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_100,(char (*) [12])"DW_LANG_C99");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_100,0xc);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_110,(char (*) [14])"DW_LANG_Ada95");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_110,0xd);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_120,(char (*) [18])"DW_LANG_Fortran95")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_120,0xe);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_130,(char (*) [12])"DW_LANG_PLI");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_130,0xf);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_140,(char (*) [13])"DW_LANG_ObjC");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_140,0x10);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_150,(char (*) [23])"DW_LANG_ObjC_plus_plus");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_150,0x11);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_160,(char (*) [12])"DW_LANG_UPC");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_160,0x12);
  StringLiteral::StringLiteral<10UL>((StringLiteral *)&local_170,(char (*) [10])"DW_LANG_D");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_170,0x13);
  StringLiteral::StringLiteral<15UL>((StringLiteral *)&local_180,(char (*) [15])"DW_LANG_Python");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_180,0x14);
  StringLiteral::StringLiteral<15UL>((StringLiteral *)&local_190,(char (*) [15])"DW_LANG_OpenCL");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_190,0x15);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_1a0,(char (*) [11])"DW_LANG_Go");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1a0,0x16);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_1b0,(char (*) [16])"DW_LANG_Modula3");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1b0,0x17);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_1c0,(char (*) [16])"DW_LANG_Haskell");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1c0,0x18);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_1d0,(char (*) [23])"DW_LANG_C_plus_plus_03");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1d0,0x19);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_1e0,(char (*) [23])"DW_LANG_C_plus_plus_11");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1e0,0x1a);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_1f0,(char (*) [14])"DW_LANG_OCaml");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_1f0,0x1b);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_200,(char (*) [13])"DW_LANG_Rust");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_200,0x1c);
  StringLiteral::StringLiteral<12UL>((StringLiteral *)&local_210,(char (*) [12])"DW_LANG_C11");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_210,0x1d);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_220,(char (*) [14])"DW_LANG_Swift");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_220,0x1e);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_230,(char (*) [14])"DW_LANG_Julia");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_230,0x1f);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_240,(char (*) [14])"DW_LANG_Dylan");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_240,0x20);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_250,(char (*) [23])"DW_LANG_C_plus_plus_14");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_250,0x21);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_260,(char (*) [18])"DW_LANG_Fortran03")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_260,0x22);
  StringLiteral::StringLiteral<18UL>((StringLiteral *)&local_270,(char (*) [18])"DW_LANG_Fortran08")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_270,0x23);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_280,(char (*) [21])"DW_LANG_RenderScript");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_280,0x24);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_290,(char (*) [14])"DW_LANG_BLISS");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_290,0x25);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_2a0,(char (*) [23])"DW_LANG_Mips_Assembler");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2a0,0x8001);
  StringLiteral::StringLiteral<28UL>
            ((StringLiteral *)&local_2b0,(char (*) [28])"DW_LANG_GOOGLE_RenderScript");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2b0,0x8e57);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_2c0,(char (*) [23])"DW_LANG_BORLAND_Delphi");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_2c0,0xb000);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getLanguage(StringRef LanguageString) {
  return StringSwitch<unsigned>(LanguageString)
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  .Case("DW_LANG_" #NAME, DW_LANG_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}